

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  InternalRunDeathTestFlag *pIVar4;
  TestEventListeners *this_00;
  TimeInMillis TVar5;
  Random *this_01;
  TestCase *this_02;
  int local_68;
  int local_64;
  undefined1 local_58 [20];
  int local_44;
  TimeInMillis TStack_40;
  int test_index;
  TimeInMillis start;
  byte local_2d;
  int i;
  bool forever;
  TestEventListener *pTStack_28;
  int repeat;
  TestEventListener *repeater;
  bool failed;
  bool has_tests_to_run;
  bool should_shard;
  UnitTestImpl *pUStack_18;
  bool in_subprocess_for_death_test;
  UnitTestImpl *this_local;
  
  pUStack_18 = this;
  bVar1 = GTestIsInitialized();
  if (bVar1) {
    if ((g_help_flag & 1) == 0) {
      PostFlagParsingInit(this);
      WriteToShardStatusFileIfNeeded();
      repeater._7_1_ = 0;
      pIVar4 = scoped_ptr<testing::internal::InternalRunDeathTestFlag>::get
                         (&this->internal_run_death_test_flag_);
      repeater._7_1_ = pIVar4 != (InternalRunDeathTestFlag *)0x0;
      repeater._6_1_ = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",(bool)repeater._7_1_);
      iVar2 = FilterTests(this,(uint)!(bool)repeater._6_1_);
      repeater._5_1_ = 0 < iVar2;
      if ((FLAGS_gtest_list_tests & 1) == 0) {
        if ((FLAGS_gtest_shuffle & 1) == 0) {
          local_64 = 0;
        }
        else {
          local_64 = GetRandomSeedFromFlag(FLAGS_gtest_random_seed);
        }
        this->random_seed_ = local_64;
        repeater._4_1_ = 0;
        this_00 = listeners(this);
        pTStack_28 = TestEventListeners::repeater(this_00);
        TVar5 = GetTimeInMillis();
        this->start_timestamp_ = TVar5;
        (*pTStack_28->_vptr_TestEventListener[2])(pTStack_28,this->parent_);
        if ((repeater._7_1_ & 1) == 0) {
          local_68 = FLAGS_gtest_repeat;
        }
        else {
          local_68 = 1;
        }
        i = local_68;
        local_2d = local_68 < 0;
        for (start._4_4_ = 0; (local_2d & 1) != 0 || start._4_4_ != i; start._4_4_ = start._4_4_ + 1
            ) {
          ClearNonAdHocTestResult(this);
          TStack_40 = GetTimeInMillis();
          if (((repeater._5_1_ & 1) != 0) && ((FLAGS_gtest_shuffle & 1) != 0)) {
            this_01 = (Random *)random(this);
            Random::Reseed(this_01,this->random_seed_);
            ShuffleTests(this);
          }
          (*pTStack_28->_vptr_TestEventListener[3])(pTStack_28,this->parent_,(ulong)start._4_4_);
          if ((repeater._5_1_ & 1) != 0) {
            (*pTStack_28->_vptr_TestEventListener[4])(pTStack_28,this->parent_);
            ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                      (&this->environments_,SetUpEnvironment);
            (*pTStack_28->_vptr_TestEventListener[5])(pTStack_28,this->parent_);
            bVar1 = Test::HasFatalFailure();
            if (!bVar1) {
              for (local_44 = 0; iVar2 = local_44, iVar3 = total_test_case_count(this),
                  iVar2 < iVar3; local_44 = local_44 + 1) {
                this_02 = GetMutableTestCase(this,local_44);
                TestCase::Run(this_02);
              }
            }
            (*pTStack_28->_vptr_TestEventListener[0xb])(pTStack_28,this->parent_);
            std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rbegin
                      ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
                       (local_58 + 8));
            std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rend
                      ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
                       local_58);
            __std__for_each<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>,void(*)(testing::Environment*)>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_void____testing__Environment____
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
                        *)(local_58 + 8),
                       (reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
                        *)local_58,TearDownEnvironment);
            (*pTStack_28->_vptr_TestEventListener[0xc])(pTStack_28,this->parent_);
          }
          TVar5 = GetTimeInMillis();
          this->elapsed_time_ = TVar5 - TStack_40;
          (*pTStack_28->_vptr_TestEventListener[0xd])(pTStack_28,this->parent_,(ulong)start._4_4_);
          bVar1 = Passed(this);
          if (!bVar1) {
            repeater._4_1_ = 1;
          }
          UnshuffleTests(this);
          if ((FLAGS_gtest_shuffle & 1) != 0) {
            iVar2 = GetNextRandomSeed(this->random_seed_);
            this->random_seed_ = iVar2;
          }
        }
        (*pTStack_28->_vptr_TestEventListener[0xe])(pTStack_28,this->parent_);
        this_local._7_1_ = (bool)((repeater._4_1_ ^ 0xff) & 1);
      }
      else {
        ListTestsMatchingFilter(this);
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    printf("%s",
           "\nThis test program did NOT call ::testing::InitGoogleTest before calling RUN_ALL_TESTS().  Please fix it.\n"
          );
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // Makes sure InitGoogleTest() was called.
  if (!GTestIsInitialized()) {
    printf("%s",
           "\nThis test program did NOT call ::testing::InitGoogleTest "
           "before calling RUN_ALL_TESTS().  Please fix it.\n");
    return false;
  }

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True iff we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_.get() != NULL);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG(shuffle) ?
      GetRandomSeedFromFlag(GTEST_FLAG(random_seed)) : 0;

  // True iff at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG(repeat);
  // Repeats forever if the repeat count is negative.
  const bool forever = repeat < 0;
  for (int i = 0; forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    const TimeInMillis start = GetTimeInMillis();

    // Shuffles test cases and tests if requested.
    if (has_tests_to_run && GTEST_FLAG(shuffle)) {
      random()->Reseed(random_seed_);
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test case if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand.
      repeater->OnEnvironmentsSetUpStart(*parent_);
      ForEach(environments_, SetUpEnvironment);
      repeater->OnEnvironmentsSetUpEnd(*parent_);

      // Runs the tests only if there was no fatal failure during global
      // set-up.
      if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_case_count();
             test_index++) {
          GetMutableTestCase(test_index)->Run();
        }
      }

      // Tears down all environments in reverse order afterwards.
      repeater->OnEnvironmentsTearDownStart(*parent_);
      std::for_each(environments_.rbegin(), environments_.rend(),
                    TearDownEnvironment);
      repeater->OnEnvironmentsTearDownEnd(*parent_);
    }

    elapsed_time_ = GetTimeInMillis() - start;

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  return !failed;
}